

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O3

StreamIn * prvTidyUserInput(TidyDocImpl *doc,TidyInputSource *source,int encoding)

{
  TidyAllocator *pTVar1;
  TidyGetByteFunc p_Var2;
  TidyUngetByteFunc p_Var3;
  TidyEOFFunc p_Var4;
  StreamIn *__s;
  tchar *ptVar5;
  
  __s = (StreamIn *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x160);
  memset(__s,0,0x158);
  __s->curcol = 1;
  __s->curline = 1;
  __s->encoding = encoding;
  __s->doc = doc;
  __s->bufsize = 5;
  pTVar1 = doc->allocator;
  __s->allocator = pTVar1;
  ptVar5 = (tchar *)(*pTVar1->vtbl->alloc)(pTVar1,0x14);
  __s->charbuf = ptVar5;
  __s->curlastpos = 0;
  __s->firstlastpos = 0;
  p_Var2 = source->getByte;
  p_Var3 = source->ungetByte;
  p_Var4 = source->eof;
  (__s->source).sourceData = source->sourceData;
  (__s->source).getByte = p_Var2;
  (__s->source).ungetByte = p_Var3;
  (__s->source).eof = p_Var4;
  __s->iotype = UserIO;
  return __s;
}

Assistant:

StreamIn* TY_(UserInput)( TidyDocImpl* doc, TidyInputSource* source, int encoding )
{
    StreamIn *in = TY_(initStreamIn)( doc, encoding );
    memcpy( &in->source, source, sizeof(TidyInputSource) );
    in->iotype = UserIO;
    return in;
}